

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execTrapcc<(moira::Core)2,(moira::Instr)173,(moira::Mode)12,1>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 uVar2;
  
  this->cp = 0;
  uVar1 = opcode & 7;
  if ((short)uVar1 != 4) {
    if (uVar1 == 3) {
      readI<(moira::Core)2,4>(this);
    }
    else {
      if (uVar1 != 2) goto LAB_003afbef;
      uVar2 = (this->reg).pc + 2;
      (this->reg).pc = uVar2;
      uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2);
      (this->queue).irc = (u16)uVar2;
      this->readBuffer = (u16)uVar2;
    }
    if (2 < (ushort)(uVar1 - 2)) goto LAB_003afbef;
    uVar1 = *(uint *)(&DAT_00472b2c + (ulong)(uVar1 - 2 & 0xffff) * 4);
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uVar1 + this->cp));
LAB_003afbef:
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  this->readBuffer = (u16)uVar2;
  return;
}

Assistant:

void
Moira::execTrapcc(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    switch (opcode & 0b111) {

        case 0b010: (void)readI<C, Word>(); break;
        case 0b011: (void)readI<C, Long>(); break;
    }

    if (cond<I>()) {

        execException<C>(M68kException::TRAPV);
        CYCLES_68020(20);
        return;
    }

    switch (opcode & 0b111) {

        case 0b100: CYCLES_68020(4); break;
        case 0b010: CYCLES_68020(6); break;
        case 0b011: CYCLES_68020(8); break;
    }

    prefetch<C, POLL>();

    FINALIZE
}